

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int multi_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *conn_00;
  connectdata *conn;
  curl_socket_t *socks_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if (conn_00 == (connectdata *)0x0) {
    data_local._4_4_ = 0;
  }
  else {
    switch(data->mstate) {
    case MSTATE_RESOLVING:
      data_local._4_4_ = Curl_resolv_getsock(data,socks);
      break;
    case MSTATE_CONNECTING:
      data_local._4_4_ = waitconnect_getsock(conn_00,socks);
      break;
    case MSTATE_TUNNELING:
      data_local._4_4_ = waitproxyconnect_getsock(conn_00,socks);
      break;
    case MSTATE_PROTOCONNECT:
    case MSTATE_PROTOCONNECTING:
      data_local._4_4_ = protocol_getsock(data,conn_00,socks);
      break;
    case MSTATE_DO:
    case MSTATE_DOING:
      data_local._4_4_ = doing_getsock(data,conn_00,socks);
      break;
    case MSTATE_DOING_MORE:
      data_local._4_4_ = domore_getsock(data,conn_00,socks);
      break;
    case MSTATE_DID:
    case MSTATE_PERFORMING:
      data_local._4_4_ = Curl_single_getsock(data,conn_00,socks);
      break;
    default:
      data_local._4_4_ = 0;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!conn)
    return 0;

  switch(data->mstate) {
  default:
    return 0;

  case MSTATE_RESOLVING:
    return Curl_resolv_getsock(data, socks);

  case MSTATE_PROTOCONNECTING:
  case MSTATE_PROTOCONNECT:
    return protocol_getsock(data, conn, socks);

  case MSTATE_DO:
  case MSTATE_DOING:
    return doing_getsock(data, conn, socks);

  case MSTATE_TUNNELING:
    return waitproxyconnect_getsock(conn, socks);

  case MSTATE_CONNECTING:
    return waitconnect_getsock(conn, socks);

  case MSTATE_DOING_MORE:
    return domore_getsock(data, conn, socks);

  case MSTATE_DID: /* since is set after DO is completed, we switch to
                        waiting for the same as the PERFORMING state */
  case MSTATE_PERFORMING:
    return Curl_single_getsock(data, conn, socks);
  }

}